

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O0

CURLcode Curl_output_ntlm(connectdata *conn,_Bool proxy)

{
  CURLcode CVar1;
  char *pcVar2;
  auth *local_60;
  auth *authp;
  ntlmdata *ntlm;
  char *passwdp;
  char *userp;
  char **allocuserpwd;
  size_t sStack_30;
  CURLcode result;
  size_t len;
  char *base64;
  connectdata *pcStack_18;
  _Bool proxy_local;
  connectdata *conn_local;
  
  len = 0;
  sStack_30 = 0;
  if (proxy) {
    userp = (char *)&conn->allocptr;
    passwdp = conn->proxyuser;
    ntlm = (ntlmdata *)conn->proxypasswd;
    authp = (auth *)&conn->proxyntlm;
    local_60 = &(conn->data->state).authproxy;
  }
  else {
    userp = (char *)&(conn->allocptr).userpwd;
    passwdp = conn->user;
    ntlm = (ntlmdata *)conn->passwd;
    authp = (auth *)&conn->ntlm;
    local_60 = &(conn->data->state).authhost;
  }
  local_60->done = false;
  if (passwdp == (char *)0x0) {
    passwdp = "";
  }
  if (ntlm == (ntlmdata *)0x0) {
    ntlm = (ntlmdata *)0x17dc61;
  }
  base64._7_1_ = proxy;
  pcStack_18 = conn;
  switch((int)authp->want) {
  case 1:
  default:
    CVar1 = Curl_auth_create_ntlm_type1_message
                      (passwdp,(char *)ntlm,(ntlmdata *)authp,(char **)&len,&stack0xffffffffffffffd0
                      );
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (len != 0) {
      (*Curl_cfree)(*(void **)userp);
      pcVar2 = "";
      if ((base64._7_1_ & 1) != 0) {
        pcVar2 = "Proxy-";
      }
      pcVar2 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar2,len);
      *(char **)userp = pcVar2;
      (*Curl_cfree)((void *)len);
      if (*(long *)userp == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    break;
  case 2:
    CVar1 = Curl_auth_create_ntlm_type3_message
                      (conn->data,passwdp,(char *)ntlm,(ntlmdata *)authp,(char **)&len,
                       &stack0xffffffffffffffd0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (len != 0) {
      (*Curl_cfree)(*(void **)userp);
      pcVar2 = "";
      if ((base64._7_1_ & 1) != 0) {
        pcVar2 = "Proxy-";
      }
      pcVar2 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar2,len);
      *(char **)userp = pcVar2;
      (*Curl_cfree)((void *)len);
      if (*(long *)userp == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      *(undefined4 *)&authp->want = 3;
      local_60->done = true;
    }
    break;
  case 3:
    *(undefined4 *)&authp->want = 4;
  case 4:
    (*Curl_cfree)(*(void **)userp);
    userp[0] = '\0';
    userp[1] = '\0';
    userp[2] = '\0';
    userp[3] = '\0';
    userp[4] = '\0';
    userp[5] = '\0';
    userp[6] = '\0';
    userp[7] = '\0';
    local_60->done = true;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_ntlm(struct connectdata *conn, bool proxy)
{
  char *base64 = NULL;
  size_t len = 0;
  CURLcode result;

  /* point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* point to the name and password for this */
  const char *userp;
  const char *passwdp;

  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  struct auth *authp;

  DEBUGASSERT(conn);
  DEBUGASSERT(conn->data);

#ifdef USE_NSS
  if(CURLE_OK != Curl_nss_force_init(conn->data))
    return CURLE_OUT_OF_MEMORY;
#endif

  if(proxy) {
    allocuserpwd = &conn->allocptr.proxyuserpwd;
    userp = conn->proxyuser;
    passwdp = conn->proxypasswd;
    ntlm = &conn->proxyntlm;
    authp = &conn->data->state.authproxy;
  }
  else {
    allocuserpwd = &conn->allocptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    ntlm = &conn->ntlm;
    authp = &conn->data->state.authhost;
  }
  authp->done = FALSE;

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#ifdef USE_WINDOWS_SSPI
  if(s_hSecDll == NULL) {
    /* not thread safe and leaks - use curl_global_init() to avoid */
    CURLcode err = Curl_sspi_global_init();
    if(s_hSecDll == NULL)
      return err;
  }
#endif

  switch(ntlm->state) {
  case NTLMSTATE_TYPE1:
  default: /* for the weird cases we (re)start here */
    /* Create a type-1 message */
    result = Curl_auth_create_ntlm_type1_message(userp, passwdp, ntlm, &base64,
                                                 &len);
    if(result)
      return result;

    if(base64) {
      free(*allocuserpwd);
      *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                              proxy ? "Proxy-" : "",
                              base64);
      free(base64);
      if(!*allocuserpwd)
        return CURLE_OUT_OF_MEMORY;

      DEBUG_OUT(fprintf(stderr, "**** Header %s\n ", *allocuserpwd));
    }
    break;

  case NTLMSTATE_TYPE2:
    /* We already received the type-2 message, create a type-3 message */
    result = Curl_auth_create_ntlm_type3_message(conn->data, userp, passwdp,
                                                 ntlm, &base64, &len);
    if(result)
      return result;

    if(base64) {
      free(*allocuserpwd);
      *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                              proxy ? "Proxy-" : "",
                              base64);
      free(base64);
      if(!*allocuserpwd)
        return CURLE_OUT_OF_MEMORY;

      DEBUG_OUT(fprintf(stderr, "**** %s\n ", *allocuserpwd));

      ntlm->state = NTLMSTATE_TYPE3; /* we send a type-3 */
      authp->done = TRUE;
    }
    break;

  case NTLMSTATE_TYPE3:
    /* connection is already authenticated,
     * don't send a header in future requests */
    ntlm->state = NTLMSTATE_LAST;
    /* fall-through */
  case NTLMSTATE_LAST:
    Curl_safefree(*allocuserpwd);
    authp->done = TRUE;
    break;
  }

  return CURLE_OK;
}